

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
punky::ast::PrefixExpression::to_string_abi_cxx11_
          (string *__return_storage_ptr__,PrefixExpression *this)

{
  bool bVar1;
  pointer pEVar2;
  allocator<char> local_d3;
  byte local_d2;
  byte local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  byte local_ae;
  byte local_ad;
  byte local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  PrefixExpression *local_18;
  PrefixExpression *this_local;
  
  local_18 = this;
  this_local = (PrefixExpression *)__return_storage_ptr__;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_right);
  local_99 = 0;
  local_ad = 0;
  local_ae = 0;
  local_d1 = 0;
  local_d2 = 0;
  if (bVar1) {
    ExprNode::token_literal_abi_cxx11_(&local_98,&this->super_ExprNode);
    local_99 = 1;
    std::operator+(&local_78,"(",&local_98);
    local_ad = 1;
    std::operator+(&local_58,&local_78," ");
    local_ae = 1;
    pEVar2 = std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>::
             operator->(&this->m_right);
    (*(pEVar2->super_AstNode)._vptr_AstNode[3])(&local_d0);
    local_d1 = 1;
    std::operator+(&local_38,&local_58,&local_d0);
    local_d2 = 1;
    std::operator+(__return_storage_ptr__,&local_38,")");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_d3);
    std::allocator<char>::~allocator(&local_d3);
  }
  if ((local_d2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_d1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((local_ae & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_ad & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PrefixExpression::to_string() const
{
    return m_right ? "(" + token_literal() + " " + m_right->to_string() + ")"
                   : "";
}